

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O3

void do_owhere(CHAR_DATA *ch,char *argument)

{
  short sVar1;
  char cVar2;
  uint uVar3;
  OBJ_DATA *pOVar4;
  bool bVar5;
  BUFFER *buffer;
  OBJ_DATA *pOVar6;
  char *pcVar7;
  char cVar8;
  bool bVar9;
  char *__format;
  OBJ_DATA *obj;
  char buf [4608];
  char *local_1240;
  char local_1238 [4616];
  
  buffer = new_buf();
  if (*argument == '\0') {
    send_to_char("Find what?\n\r",ch);
    return;
  }
  if (object_list == (OBJ_DATA *)0x0) {
LAB_0026b2d6:
    send_to_char("Nothing like that in heaven or earth.\n\r",ch);
  }
  else {
    bVar9 = false;
    obj = object_list;
    uVar3 = 0;
    do {
      while (((bVar5 = can_see_obj(ch,obj), !bVar5 || (bVar5 = is_name(argument,obj->name), !bVar5))
             || (pOVar4 = obj, ch->level < obj->level))) {
LAB_0026b1c3:
        obj = obj->next;
        if (obj == (OBJ_DATA *)0x0) {
          if (!bVar9) goto LAB_0026b2d6;
          goto LAB_0026b2c1;
        }
      }
      do {
        pOVar6 = pOVar4;
        pOVar4 = pOVar6->in_obj;
      } while (pOVar6->in_obj != (OBJ_DATA *)0x0);
      if (((pOVar6->carried_by == (CHAR_DATA *)0x0) ||
          (bVar5 = can_see(ch,pOVar6->carried_by), !bVar5)) ||
         (pOVar6->carried_by->in_room == (ROOM_INDEX_DATA *)0x0)) {
        if ((pOVar6->in_room == (ROOM_INDEX_DATA *)0x0) ||
           (bVar5 = can_see_room(ch,pOVar6->in_room), !bVar5)) goto LAB_0026b1c3;
        local_1240 = obj->short_descr;
        pcVar7 = get_room_name(pOVar6->in_room);
        sVar1 = pOVar6->in_room->vnum;
        __format = "%3d) %s is in %s [Room %d]\n\r";
      }
      else {
        local_1240 = obj->short_descr;
        pcVar7 = pers(pOVar6->carried_by,ch);
        sVar1 = pOVar6->carried_by->in_room->vnum;
        __format = "%3d) %s is carried by %s [Room %d]\n\r";
      }
      sprintf(local_1238,__format,(ulong)(uVar3 + 1),local_1240,pcVar7,(ulong)(uint)(int)sVar1);
      cVar2 = (char)local_1238._0_4_;
      cVar8 = cVar2 + -0x20;
      if (0x19 < (byte)(cVar2 + 0x9fU)) {
        cVar8 = cVar2;
      }
      local_1238[0] = cVar8;
      add_buf(buffer,local_1238);
      if (0xc6 < (int)uVar3) break;
      obj = obj->next;
      bVar9 = true;
      uVar3 = uVar3 + 1;
    } while (obj != (OBJ_DATA *)0x0);
LAB_0026b2c1:
    pcVar7 = buf_string(buffer);
    page_to_char(pcVar7,ch);
  }
  free_buf(buffer);
  return;
}

Assistant:

void do_owhere(CHAR_DATA *ch, char *argument)
{
	char buf[MAX_INPUT_LENGTH];
	BUFFER *buffer;
	OBJ_DATA *obj;
	OBJ_DATA *in_obj;
	bool found;
	int number = 0, max_found;

	found = false;
	number = 0;
	max_found = 200;

	buffer = new_buf();

	if (argument[0] == '\0')
	{
		send_to_char("Find what?\n\r", ch);
		return;
	}

	for (obj = object_list; obj != nullptr; obj = obj->next)
	{
		if (!can_see_obj(ch, obj) || !is_name(argument, obj->name) || ch->level < obj->level)
			continue;

		number++;

		for (in_obj = obj; in_obj->in_obj != nullptr; in_obj = in_obj->in_obj)
			;

		if (in_obj->carried_by != nullptr && can_see(ch, in_obj->carried_by) && in_obj->carried_by->in_room != nullptr)
		{
			sprintf(buf, "%3d) %s is carried by %s [Room %d]\n\r",
				number, obj->short_descr,
				pers(in_obj->carried_by, ch),
				in_obj->carried_by->in_room->vnum);
		}
		else if (in_obj->in_room != nullptr && can_see_room(ch, in_obj->in_room))
		{
			sprintf(buf, "%3d) %s is in %s [Room %d]\n\r",
				number,
				obj->short_descr,
				get_room_name(in_obj->in_room),
				in_obj->in_room->vnum);
		}
		else
		{
			number--;
			continue;
		}

		found = true;

		buf[0] = UPPER(buf[0]);
		add_buf(buffer, buf);

		if (number >= max_found)
			break;
	}

	if (!found)
		send_to_char("Nothing like that in heaven or earth.\n\r", ch);
	else
		page_to_char(buf_string(buffer), ch);

	free_buf(buffer);
}